

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O3

base_learner * cbifyldf_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  float *pfVar6;
  int iVar7;
  cbify *pcVar8;
  option_group_definition *poVar9;
  typed_option<float> *ptVar10;
  base_learner *l;
  multi_learner *base;
  learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar11;
  long lVar12;
  undefined **ppuVar13;
  label_parser *plVar14;
  byte bVar15;
  float fVar16;
  float fVar17;
  bool cbify_ldf_option;
  size_type __dnew_3;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_2;
  bool local_439;
  cbify *local_438;
  vw *local_430;
  _func_int ***local_428;
  _func_int **local_420;
  _func_int **local_418 [2];
  float *local_408;
  float *local_400;
  long local_3f8;
  _func_int ***local_3f0;
  _func_int **local_3e8;
  _func_int **local_3e0 [2];
  _func_int ***local_3d0;
  _func_int **local_3c8;
  _func_int **local_3c0 [2];
  string local_3b0;
  string local_390;
  undefined1 local_370 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_358 [7];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d8;
  option_group_definition local_2d0;
  long *local_298;
  long local_290;
  long local_288 [2];
  string local_278;
  undefined1 local_258 [112];
  bool local_1e8;
  ios_base local_1d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  typed_option<float> local_d0;
  
  bVar15 = 0;
  local_430 = all;
  pcVar8 = calloc_or_throw<cbify>(1);
  local_438 = pcVar8;
  memset(pcVar8,0,0xd0);
  local_439 = false;
  local_258._0_8_ = (_func_int **)0x25;
  local_428 = local_418;
  local_428 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_428,(ulong)local_258);
  local_418[0] = (_func_int **)local_258._0_8_;
  local_428[2] = (_func_int **)0x746e6f43206f746e;
  local_428[3] = (_func_int **)0x42206c6175747865;
  *local_428 = (_func_int **)0x6f736320656b614d;
  local_428[1] = (_func_int **)0x692066646c5f6161;
  builtin_strncpy((char *)((long)local_428 + 0x1d),"l Bandit",8);
  local_420 = (_func_int **)local_258._0_8_;
  *(char *)((long)local_428 + local_258._0_8_) = '\0';
  local_2d0.m_name._M_dataplus._M_p = (pointer)&local_2d0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,local_428,(char *)(local_258._0_8_ + (long)local_428));
  local_2d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_428 != local_418) {
    operator_delete(local_428);
  }
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  local_390.field_2._M_allocated_capacity = 0x646c5f7966696263;
  local_390.field_2._8_2_ = 0x66;
  local_390._M_string_length = 9;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_258,&local_390,&local_439);
  local_1e8 = true;
  local_3d0 = local_3c0;
  local_370._0_8_ = (_func_int **)0x32;
  local_3d0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_3d0,(ulong)local_370);
  local_3c0[0] = (_func_int **)local_370._0_8_;
  local_3d0[4] = (_func_int **)0x646e6162206c6175;
  local_3d0[5] = (_func_int **)0x6c626f7270207469;
  local_3d0[2] = (_func_int **)0x61206f746e692066;
  local_3d0[3] = (_func_int **)0x747865746e6f6320;
  *local_3d0 = (_func_int **)0x20747265766e6f43;
  local_3d0[1] = (_func_int **)0x646c5f61616f7363;
  *(undefined2 *)(local_3d0 + 6) = 0x6d65;
  local_3c8 = (_func_int **)local_370._0_8_;
  *(char *)((long)local_3d0 + local_370._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_258 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_2d0,(typed_option<bool> *)local_258);
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0.field_2._M_allocated_capacity._0_4_ = 0x73736f6c;
  local_3b0.field_2._M_allocated_capacity._4_2_ = 0x30;
  local_3b0._M_string_length = 5;
  local_400 = &pcVar8->loss0;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_370,&local_3b0,local_400);
  ptVar10 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_370,0.0);
  local_3f0 = local_3e0;
  local_d0.super_base_option._vptr_base_option = (_func_int **)0x16;
  local_3f0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_3f0,(ulong)&local_d0);
  local_3e0[0] = local_d0.super_base_option._vptr_base_option;
  *local_3f0 = (_func_int **)0x726f662073736f6c;
  local_3f0[1] = (_func_int **)0x74636572726f6320;
  builtin_strncpy((char *)((long)local_3f0 + 0xe),"ct label",8);
  local_3e8 = local_d0.super_base_option._vptr_base_option;
  *(char *)((long)local_3f0 + (long)local_d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar9,ptVar10);
  local_278.field_2._M_allocated_capacity._0_4_ = 0x73736f6c;
  local_278.field_2._M_allocated_capacity._4_2_ = 0x31;
  local_278._M_string_length = 5;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  VW::config::typed_option<float>::typed_option(&local_d0,&local_278,&pcVar8->loss1);
  local_408 = &pcVar8->loss1;
  ptVar10 = VW::config::typed_option<float>::default_value(&local_d0,1.0);
  local_3f8 = 0x18;
  local_298 = local_288;
  local_298 = (long *)std::__cxx11::string::_M_create((ulong *)&local_298,(ulong)&local_3f8);
  local_288[0] = local_3f8;
  *local_298 = 0x726f662073736f6c;
  local_298[1] = 0x6572726f636e6920;
  local_298[2] = 0x6c6562616c207463;
  local_290 = local_3f8;
  *(char *)((long)local_298 + local_3f8) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar9,ptVar10);
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6200;
  if (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_3f0 != local_3e0) {
    operator_delete(local_3f0);
  }
  local_370._0_8_ = &PTR__typed_option_002d6200;
  if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
  }
  if (local_2e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if (local_3d0 != local_3c0) {
    operator_delete(local_3d0);
  }
  local_258._0_8_ = &PTR__typed_option_002d60f0;
  if (local_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0._M_pi);
  }
  if (local_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_2d0);
  pp_Var1 = (_func_int **)(local_258 + 0x10);
  local_258._16_6_ = 0x5f7966696263;
  local_258[0x16] = 0x6c;
  local_258[0x17] = 100;
  local_258[0x18] = 'f';
  local_258[0x19] = '\0';
  local_258._8_8_ = (pointer)0x9;
  local_258._0_8_ = pp_Var1;
  iVar7 = (*options->_vptr_options_i[1])(options,local_258);
  if ((_func_int **)local_258._0_8_ != pp_Var1) {
    operator_delete((void *)local_258._0_8_);
  }
  if ((char)iVar7 == '\0') {
    plVar11 = (learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
    pcVar8 = local_438;
  }
  else {
    local_438->app_seed = 0x337ad8c;
    local_438->all = local_430;
    local_438->use_adf = true;
    local_258._16_6_ = 0x7078655f6263;
    local_258[0x16] = 0x6c;
    local_258[0x17] = 0x6f;
    local_258[0x18] = 'r';
    local_258[0x19] = 'e';
    local_258[0x1a] = '_';
    local_258[0x1b] = 'a';
    local_258._28_2_ = 0x6664;
    local_258._8_8_ = (pointer)0xe;
    local_258[0x1e] = '\0';
    local_258._0_8_ = pp_Var1;
    iVar7 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_258._0_8_ != pp_Var1) {
      operator_delete((void *)local_258._0_8_);
    }
    if ((char)iVar7 == '\0') {
      local_258._16_6_ = 0x7078655f6263;
      local_258[0x16] = 0x6c;
      local_258[0x17] = 0x6f;
      local_258[0x18] = 'r';
      local_258[0x19] = 'e';
      local_258[0x1a] = '_';
      local_258[0x1b] = 'a';
      local_258._28_2_ = 0x6664;
      local_258._8_8_ = (pointer)0xe;
      local_258[0x1e] = '\0';
      local_370._8_8_ = (pointer)0x0;
      local_370[0x10] = '\0';
      local_370._0_8_ = local_370 + 0x10;
      local_258._0_8_ = pp_Var1;
      (*options->_vptr_options_i[5])(options,local_258,local_370);
      if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
        operator_delete((void *)local_370._0_8_);
      }
      if ((_func_int **)local_258._0_8_ != pp_Var1) {
        operator_delete((void *)local_258._0_8_);
      }
    }
    pfVar6 = local_400;
    local_258._16_6_ = 0x6e696d5f6263;
    local_258[0x16] = 0x5f;
    local_258[0x17] = 99;
    local_258[0x18] = 'o';
    local_258[0x19] = 's';
    local_258[0x1a] = 't';
    local_258._8_8_ = (pointer)0xb;
    local_258[0x1b] = '\0';
    local_258._0_8_ = pp_Var1;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
               vsnprintf,0x3a,"%f",(double)*local_400);
    (*options->_vptr_options_i[5])(options,local_258,local_370);
    pfVar5 = local_408;
    pp_Var2 = (_func_int **)(local_370 + 0x10);
    if ((_func_int **)local_370._0_8_ != pp_Var2) {
      operator_delete((void *)local_370._0_8_);
    }
    if ((_func_int **)local_258._0_8_ != pp_Var1) {
      operator_delete((void *)local_258._0_8_);
    }
    local_258._16_6_ = 0x78616d5f6263;
    local_258[0x16] = 0x5f;
    local_258[0x17] = 99;
    local_258[0x18] = 'o';
    local_258[0x19] = 's';
    local_258[0x1a] = 't';
    local_258._8_8_ = (pointer)0xb;
    local_258[0x1b] = '\0';
    local_258._0_8_ = pp_Var1;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
               vsnprintf,0x3a,"%f",(double)*pfVar5);
    (*options->_vptr_options_i[5])(options,local_258,local_370);
    if ((_func_int **)local_370._0_8_ != pp_Var2) {
      operator_delete((void *)local_370._0_8_);
    }
    if ((_func_int **)local_258._0_8_ != pp_Var1) {
      operator_delete((void *)local_258._0_8_);
    }
    local_258._16_6_ = 0x696c65736162;
    local_258[0x16] = 0x6e;
    local_258[0x17] = 0x65;
    local_258._8_8_ = (pointer)0x8;
    local_258[0x18] = '\0';
    local_258._0_8_ = pp_Var1;
    iVar7 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_258._0_8_ != pp_Var1) {
      operator_delete((void *)local_258._0_8_);
    }
    pcVar8 = local_438;
    if ((char)iVar7 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_258);
      fVar3 = *pfVar6;
      fVar4 = pfVar6[1];
      fVar16 = ABS(fVar3);
      fVar17 = ABS(fVar4);
      if (fVar17 <= fVar16) {
        fVar17 = fVar16;
      }
      std::ostream::_M_insert<double>((double)(fVar17 / (fVar4 - fVar3)));
      local_370[0x10] = 'l';
      local_370._17_4_ = 0x756d5f72;
      local_370._21_3_ = 0x69746c;
      aaStack_358[0]._M_allocated_capacity._0_5_ = 0x7265696c70;
      local_370._8_8_ = (pointer)0xd;
      aaStack_358[0]._M_local_buf[5] = '\0';
      local_370._0_8_ = pp_Var2;
      std::__cxx11::stringbuf::str();
      (*options->_vptr_options_i[5])(options,local_370,&local_d0);
      if (local_d0.super_base_option._vptr_base_option !=
          (_func_int **)&local_d0.super_base_option.m_name._M_string_length) {
        operator_delete(local_d0.super_base_option._vptr_base_option);
      }
      if ((_func_int **)local_370._0_8_ != pp_Var2) {
        operator_delete((void *)local_370._0_8_);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_258);
      std::ios_base::~ios_base(local_1d8);
    }
    l = setup_base(options,local_430);
    base = LEARNER::as_multiline<char,char>(l);
    plVar11 = LEARNER::learner<cbify,std::vector<example*,std::allocator<example*>>>::
              init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                        (pcVar8,base,do_actual_learning_ldf<true>,do_actual_learning_ldf<false>,1,
                         multiclass);
    *(undefined8 *)(plVar11 + 0xb8) = *(undefined8 *)(plVar11 + 0x18);
    *(undefined8 *)(plVar11 + 0xc0) = *(undefined8 *)(plVar11 + 0x20);
    *(code **)(plVar11 + 200) = finish;
    *(undefined8 *)(plVar11 + 0x58) = *(undefined8 *)(plVar11 + 0x18);
    *(code **)(plVar11 + 0x68) = finish_multiline_example;
    ppuVar13 = &COST_SENSITIVE::cs_label;
    plVar14 = &local_430->p->lp;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      plVar14->default_label = (_func_void_void_ptr *)*ppuVar13;
      ppuVar13 = ppuVar13 + (ulong)bVar15 * -2 + 1;
      plVar14 = (label_parser *)((long)plVar14 + (ulong)bVar15 * -0x10 + 8);
    }
    local_430->delete_prediction = (_func_void_void_ptr *)0x0;
    pcVar8 = (cbify *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_2d0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
    operator_delete(local_2d0.m_name._M_dataplus._M_p);
  }
  if (pcVar8 != (cbify *)0x0) {
    destroy_free<cbify>(pcVar8);
  }
  return (base_learner *)plVar11;
}

Assistant:

base_learner* cbifyldf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cbify>();
  bool cbify_ldf_option = false;

  option_group_definition new_options("Make csoaa_ldf into Contextual Bandit");
  new_options
      .add(make_option("cbify_ldf", cbify_ldf_option).keep().help("Convert csoaa_ldf into a contextual bandit problem"))
      .add(make_option("loss0", data->loss0).default_value(0.f).help("loss for correct label"))
      .add(make_option("loss1", data->loss1).default_value(1.f).help("loss for incorrect label"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cbify_ldf"))
    return nullptr;

  data->app_seed = uniform_hash("vw", 2, 0);
  data->all = &all;
  data->use_adf=true;

  if (!options.was_supplied("cb_explore_adf"))
  {
    options.insert("cb_explore_adf", "");
  }
  options.insert("cb_min_cost", to_string(data->loss0));
  options.insert("cb_max_cost", to_string(data->loss1));

  if (options.was_supplied("baseline"))
  {
    stringstream ss;
    ss << max<float>(abs(data->loss0), abs(data->loss1)) / (data->loss1 - data->loss0);
    options.insert("lr_multiplier", ss.str());
  }

  multi_learner* base = as_multiline(setup_base(options, all));
  learner<cbify,multi_ex>& l = init_learner(data, base, do_actual_learning_ldf<true>, do_actual_learning_ldf<false>, 1, prediction_type::multiclass);

  l.set_finish(finish);
  l.set_finish_example(finish_multiline_example);
  all.p->lp = COST_SENSITIVE::cs_label;
  all.delete_prediction = nullptr;

  return make_base(l);
}